

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

bool deqp::gls::BufferTestUtil::compareByteArrays
               (TestLog *log,deUint8 *resPtr,deUint8 *refPtr,int numBytes)

{
  MessageBuilder *pMVar1;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> AVar2;
  char (*local_a10) [21];
  MessageBuilder local_8f0;
  MessageBuilder local_770;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_5f0;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_5e8;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> local_5e0;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_5d0;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_5c8;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> local_5c0;
  MessageBuilder local_5b0;
  int local_430;
  int local_42c;
  int printLen_1;
  int len_1;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_2a8;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_2a0;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> local_298;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_288;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_280;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> local_278;
  MessageBuilder local_268;
  int local_e4;
  int local_e0;
  int printLen;
  int len;
  allocator<char> local_a1;
  string local_a0;
  LogSection local_80;
  int local_3c;
  int local_38;
  int ndx;
  int diffSpanStart;
  int numDiffSpans;
  int maxDiffSpans;
  int maxSpanLen;
  bool isOk;
  deUint8 *pdStack_20;
  int numBytes_local;
  deUint8 *refPtr_local;
  deUint8 *resPtr_local;
  TestLog *log_local;
  
  maxDiffSpans._3_1_ = 1;
  numDiffSpans = 8;
  diffSpanStart = 4;
  ndx = 0;
  local_38 = -1;
  local_3c = 0;
  maxSpanLen = numBytes;
  pdStack_20 = refPtr;
  refPtr_local = resPtr;
  resPtr_local = (deUint8 *)log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Verify",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&len,"Verification result",(allocator<char> *)((long)&printLen + 3));
  tcu::LogSection::LogSection(&local_80,&local_a0,(string *)&len);
  tcu::TestLog::operator<<(log,&local_80);
  tcu::LogSection::~LogSection(&local_80);
  std::__cxx11::string::~string((string *)&len);
  std::allocator<char>::~allocator((allocator<char> *)((long)&printLen + 3));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  while( true ) {
    if (maxSpanLen <= local_3c) break;
    if (refPtr_local[local_3c] == pdStack_20[local_3c]) {
      if (-1 < local_38) {
        if (ndx < 4) {
          local_e0 = local_3c - local_38;
          local_e4 = de::min<int>(local_e0,8);
          tcu::TestLog::operator<<
                    (&local_268,(TestLog *)resPtr_local,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar1 = tcu::MessageBuilder::operator<<(&local_268,&local_e0);
          pMVar1 = tcu::MessageBuilder::operator<<
                             (pMVar1,(char (*) [28])" byte difference at offset ");
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_38);
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])"  expected ");
          tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                    (&local_280,pdStack_20 + local_38);
          tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                    (&local_288,pdStack_20 + (long)local_e4 + (long)local_38);
          AVar2 = tcu::formatArray<tcu::Format::HexIterator<unsigned_char,unsigned_char_const*>>
                            (&local_280,&local_288);
          local_278 = AVar2;
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_278);
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])"  got ");
          tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                    (&local_2a0,refPtr_local + local_38);
          tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                    (&local_2a8,refPtr_local + (long)local_e4 + (long)local_38);
          AVar2 = tcu::formatArray<tcu::Format::HexIterator<unsigned_char,unsigned_char_const*>>
                            (&local_2a0,&local_2a8);
          local_298 = AVar2;
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_298);
          tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_268);
        }
        else {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&printLen_1,(TestLog *)resPtr_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar1 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&printLen_1,
                              (char (*) [29])"(output too long, truncated)");
          tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&printLen_1);
        }
        ndx = ndx + 1;
        local_38 = -1;
      }
    }
    else {
      if (local_38 < 0) {
        local_38 = local_3c;
      }
      maxDiffSpans._3_1_ = 0;
    }
    local_3c = local_3c + 1;
  }
  if (-1 < local_38) {
    if (ndx < 4) {
      local_42c = local_3c - local_38;
      local_430 = de::min<int>(local_42c,8);
      tcu::TestLog::operator<<
                (&local_5b0,(TestLog *)resPtr_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_5b0,&local_42c);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [28])" byte difference at offset ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_38);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])"  expected ");
      tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                (&local_5c8,pdStack_20 + local_38);
      tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                (&local_5d0,pdStack_20 + (long)local_430 + (long)local_38);
      local_5c0 = tcu::formatArray<tcu::Format::HexIterator<unsigned_char,unsigned_char_const*>>
                            (&local_5c8,&local_5d0);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_5c0);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])"  got ");
      tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                (&local_5e8,refPtr_local + local_38);
      tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>::HexIterator
                (&local_5f0,refPtr_local + (long)local_430 + (long)local_38);
      local_5e0 = tcu::formatArray<tcu::Format::HexIterator<unsigned_char,unsigned_char_const*>>
                            (&local_5e8,&local_5f0);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_5e0);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5b0);
    }
    else {
      tcu::TestLog::operator<<
                (&local_770,(TestLog *)resPtr_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_770,(char (*) [29])"(output too long, truncated)");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_770);
    }
  }
  tcu::TestLog::operator<<
            (&local_8f0,(TestLog *)resPtr_local,(BeginMessageToken *)&tcu::TestLog::Message);
  if ((maxDiffSpans._3_1_ & 1) == 0) {
    local_a10 = (char (*) [21])0x2b9582f;
  }
  else {
    local_a10 = (char (*) [21])0x2b9581a;
  }
  pMVar1 = tcu::MessageBuilder::operator<<(&local_8f0,local_a10);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8f0);
  tcu::TestLog::operator<<((TestLog *)resPtr_local,(EndSectionToken *)&tcu::TestLog::EndSection);
  return (bool)(maxDiffSpans._3_1_ & 1);
}

Assistant:

bool compareByteArrays (tcu::TestLog& log, const deUint8* resPtr, const deUint8* refPtr, int numBytes)
{
	bool			isOk			= true;
	const int		maxSpanLen		= 8;
	const int		maxDiffSpans	= 4;
	int				numDiffSpans	= 0;
	int				diffSpanStart	= -1;
	int				ndx				= 0;

	log << TestLog::Section("Verify", "Verification result");

	for (;ndx < numBytes; ndx++)
	{
		if (resPtr[ndx] != refPtr[ndx])
		{
			if (diffSpanStart < 0)
				diffSpanStart = ndx;

			isOk = false;
		}
		else if (diffSpanStart >= 0)
		{
			if (numDiffSpans < maxDiffSpans)
			{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;

			numDiffSpans	+= 1;
			diffSpanStart	 = -1;
		}
	}

	if (diffSpanStart >= 0)
	{
		if (numDiffSpans < maxDiffSpans)
		{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
		}
		else
			log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;
	}

	log << TestLog::Message << (isOk ? "Verification passed." : "Verification FAILED!") << TestLog::EndMessage;
	log << TestLog::EndSection;

	return isOk;
}